

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall
ON_Font::SetFontCharacteristics
          (ON_Font *this,wchar_t *gdi_logfont_name,bool bBold,bool bItalic,bool bUnderlined,
          bool bStrikethrough)

{
  bool bVar1;
  bool bStrikethrough_local;
  bool bUnderlined_local;
  bool bItalic_local;
  bool bBold_local;
  wchar_t *gdi_logfont_name_local;
  ON_Font *this_local;
  
  bVar1 = SetFontCharacteristics(this,0.0,gdi_logfont_name,bBold,bItalic,bUnderlined,bStrikethrough)
  ;
  return bVar1;
}

Assistant:

bool ON_Font::SetFontCharacteristics(
  const wchar_t* gdi_logfont_name,
  bool bBold,
  bool bItalic,
  bool bUnderlined,
  bool bStrikethrough
  )
{
  return SetFontCharacteristics(
    0.0,
    gdi_logfont_name,
    bBold,
    bItalic,
    bUnderlined,
    bStrikethrough
  );
}